

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

string * player_not_found_message_abi_cxx11_(string *__return_storage_ptr__,string_view name)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = 0x50203a726f727245;
  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 7) = 0x2220726579616c50;
  __return_storage_ptr__->_M_string_length = 0xf;
  (__return_storage_ptr__->field_2)._M_local_buf[0xf] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,name._M_str,name._M_len);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"\" not found.");
  return __return_storage_ptr__;
}

Assistant:

std::string player_not_found_message(std::string_view name) {
	std::string result = "Error: Player \""s;
	result += name;
	result += "\" not found.";
	return result;
}